

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O3

bool EV_DoDonut(int tag,line_t_conflict *line,double pillarspeed,double slimespeed)

{
  line_t_conflict *plVar1;
  sector_t_conflict *this;
  bool bVar2;
  uint uVar3;
  DMovingFloor *pDVar4;
  long lVar5;
  sector_t_conflict *this_00;
  bool bVar6;
  sector_t_conflict *this_01;
  double dVar7;
  vertex_t *spot;
  FSectorTagIterator itr;
  vertex_t *local_50;
  FSectorTagIterator local_48;
  DThinker *local_40;
  DThinker *local_38;
  
  if (tag == 0) {
    local_48.searchtag = -0x80000000;
    local_48.start = -1;
    if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
      local_48.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
    }
  }
  else {
    local_48.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    local_48.searchtag = tag;
  }
  bVar6 = false;
  local_40 = (DThinker *)pillarspeed;
  local_38 = (DThinker *)slimespeed;
  do {
    do {
      do {
        uVar3 = FSectorTagIterator::Next(&local_48);
        if ((int)uVar3 < 0) {
          return bVar6;
        }
        this_01 = sectors + uVar3;
        bVar2 = sector_t::PlaneMoving(this_01,0);
      } while (bVar2);
      plVar1 = *this_01->lines;
      bVar6 = true;
    } while (((plVar1->flags & 4) == 0) ||
            ((((this_00 = plVar1->frontsector, this_00 == this_01 &&
               (this_00 = plVar1->backsector, this_00 == this_01)) ||
              (this_00 == (sector_t_conflict *)0x0)) ||
             ((bVar2 = sector_t::PlaneMoving(this_00,0), bVar2 || ((long)this_00->linecount < 1)))))
            );
    lVar5 = 0;
    do {
      if (((this_00->lines[lVar5]->flags & 4) != 0) &&
         (this = this_00->lines[lVar5]->backsector, this != this_01)) {
        pDVar4 = (DMovingFloor *)
                 M_Malloc_Dbg(0xa0,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DMovingFloor::DMovingFloor(pDVar4,this_00);
        (pDVar4->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
             (_func_int **)&PTR_StaticType_006f8dd0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.ObjNext =
             (DObject *)0x0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.GCNext =
             (DObject *)0x0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.ObjectFlags = 0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
             (_func_int **)0xffffffff00000016;
        *(undefined1 *)
         &pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.Class = 0;
        *(undefined4 *)
         ((long)&pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.Class + 4)
             = 1;
        (pDVar4->super_DMover).super_DSectorEffect.m_Sector = this_00;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.PrevThinker = local_38;
        *(int *)&pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.field_0x24
             = this->planes[0].Texture.texnum;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.ObjNext =
             (DObject *)0x0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.GCNext =
             (DObject *)0x0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.ObjectFlags = 0;
        dVar7 = sector_t::FindHighestFloorPoint((sector_t *)this,&local_50);
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.NextThinker =
             (DThinker *)
             -(dVar7 * (this_00->floorplane).normal.Z +
              (this_00->floorplane).normal.Y * (local_50->p).Y +
              (this_00->floorplane).normal.X * (local_50->p).X);
        StartFloorSound((pDVar4->super_DMover).super_DSectorEffect.m_Sector);
        pDVar4 = (DMovingFloor *)
                 M_Malloc_Dbg(0xa0,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DMovingFloor::DMovingFloor(pDVar4,this_01);
        (pDVar4->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
             (_func_int **)&PTR_StaticType_006f8dd0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.ObjNext =
             (DObject *)0x0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.GCNext =
             (DObject *)0x0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.ObjectFlags = 0;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
             (_func_int **)0xffffffff00000001;
        *(undefined1 *)
         &pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.Class = 0;
        *(undefined4 *)
         ((long)&pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.super_DObject.Class + 4)
             = 0xffffffff;
        (pDVar4->super_DMover).super_DSectorEffect.m_Sector = this_01;
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.PrevThinker = local_40;
        dVar7 = sector_t::FindHighestFloorPoint((sector_t *)this,&local_50);
        pDVar4[1].super_DMover.super_DSectorEffect.super_DThinker.NextThinker =
             (DThinker *)
             -(dVar7 * (this_01->floorplane).normal.Z +
              (this_01->floorplane).normal.Y * (local_50->p).Y +
              (this_01->floorplane).normal.X * (local_50->p).X);
        StartFloorSound((pDVar4->super_DMover).super_DSectorEffect.m_Sector);
        break;
      }
      lVar5 = lVar5 + 1;
    } while (this_00->linecount != lVar5);
  } while( true );
}

Assistant:

bool EV_DoDonut (int tag, line_t *line, double pillarspeed, double slimespeed)
{
	sector_t*			s1;
	sector_t*			s2;
	sector_t*			s3;
	int 				secnum;
	bool 				rtn;
	int 				i;
	DFloor*				floor;
	vertex_t*			spot;
	double				height;
		
	rtn = false;

	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		s1 = &sectors[secnum];					// s1 is pillar's sector

		// ALREADY MOVING?	IF SO, KEEP GOING...
		if (s1->PlaneMoving(sector_t::floor))
			continue; // safe now, because we check that tag is non-0 in the looping condition [fdari]
						
		rtn = true;
		s2 = getNextSector (s1->lines[0], s1);	// s2 is pool's sector
		if (!s2)								// note lowest numbered line around
			continue;							// pillar must be two-sided

		if (s2->PlaneMoving(sector_t::floor))
			continue;

		for (i = 0; i < s2->linecount; i++)
		{
			if (!(s2->lines[i]->flags & ML_TWOSIDED) ||
				(s2->lines[i]->backsector == s1))
				continue;
			s3 = s2->lines[i]->backsector;
			
			//	Spawn rising slime
			floor = new DFloor (s2);
			floor->m_Type = DFloor::donutRaise;
			floor->m_Crush = -1;
			floor->m_Hexencrush = false;
			floor->m_Direction = 1;
			floor->m_Sector = s2;
			floor->m_Speed = slimespeed;
			floor->m_Texture = s3->GetTexture(sector_t::floor);
			floor->m_NewSpecial.Clear();
			height = s3->FindHighestFloorPoint (&spot);
			floor->m_FloorDestDist = s2->floorplane.PointToDist (spot, height);
			floor->StartFloorSound ();
			
			//	Spawn lowering donut-hole
			floor = new DFloor (s1);
			floor->m_Type = DFloor::floorLowerToNearest;
			floor->m_Crush = -1;
			floor->m_Hexencrush = false;
			floor->m_Direction = -1;
			floor->m_Sector = s1;
			floor->m_Speed = pillarspeed;
			height = s3->FindHighestFloorPoint (&spot);
			floor->m_FloorDestDist = s1->floorplane.PointToDist (spot, height);
			floor->StartFloorSound ();
			break;
		}
	}
	return rtn;
}